

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2651d::DryRunCommandRunner::WaitForCommand
          (DryRunCommandRunner *this,Result *result)

{
  bool bVar1;
  reference ppEVar2;
  Result *result_local;
  DryRunCommandRunner *this_local;
  
  bVar1 = std::queue<Edge_*,_std::deque<Edge_*,_std::allocator<Edge_*>_>_>::empty(&this->finished_);
  if (!bVar1) {
    result->status = ExitSuccess;
    ppEVar2 = std::queue<Edge_*,_std::deque<Edge_*,_std::allocator<Edge_*>_>_>::front
                        (&this->finished_);
    result->edge = *ppEVar2;
    std::queue<Edge_*,_std::deque<Edge_*,_std::allocator<Edge_*>_>_>::pop(&this->finished_);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool DryRunCommandRunner::WaitForCommand(Result* result) {
   if (finished_.empty())
     return false;

   result->status = ExitSuccess;
   result->edge = finished_.front();
   finished_.pop();
   return true;
}